

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

char * sqlite3VdbeExpandSql(Vdbe *p,char *zRawSql)

{
  uchar *puVar1;
  ushort uVar2;
  Mem *pMVar3;
  Vdbe *pVVar4;
  int iVar5;
  int nName;
  long lVar6;
  char *pcVar7;
  long lVar8;
  uchar *puVar9;
  long lVar10;
  long lVar11;
  int nTotal;
  int N;
  int idx;
  StrAccum out;
  int tokenType;
  char zBase [100];
  int local_124;
  StrAccum local_120;
  long local_f8;
  Vdbe *local_f0;
  MemValue local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  sqlite3 *psStack_c0;
  undefined8 local_b8;
  sqlite3 *local_a8;
  long local_a0;
  char local_98 [104];
  
  local_124 = 0;
  local_120.db = p->db;
  local_120.mxAlloc = (local_120.db)->aLimit[0];
  local_120.zBase = local_98;
  local_120.nChar = 0;
  local_120.nAlloc = 100;
  local_120.useMalloc = '\x01';
  local_120.accError = '\0';
  local_120.zText = local_120.zBase;
  if ((local_120.db)->nVdbeExec < 2) {
    local_f0 = p;
    local_a8 = local_120.db;
    if (*zRawSql != '\0') {
      iVar5 = 1;
      do {
        N = 0;
        puVar9 = (uchar *)zRawSql;
        do {
          nName = sqlite3GetToken(puVar9,&local_e8.nZero);
          if (local_e8.nZero == 0x87) goto LAB_00136bc8;
          N = N + nName;
          puVar1 = puVar9 + nName;
          puVar9 = puVar9 + nName;
        } while (*puVar1 != '\0');
        nName = 0;
LAB_00136bc8:
        lVar11 = (long)local_120.nChar;
        if (local_120.nChar + N < local_120.nAlloc) {
          local_120.nChar = local_120.nChar + N;
          memcpy(local_120.zText + lVar11,zRawSql,(long)N);
        }
        else {
          enlargeAndAppend(&local_120,zRawSql,N);
        }
        pVVar4 = local_f0;
        if (nName == 0) break;
        puVar9 = (uchar *)zRawSql + N;
        if (*puVar9 == '?') {
          if (1 < nName) {
            sqlite3GetInt32((char *)(puVar9 + 1),&local_124);
            iVar5 = local_124;
          }
        }
        else {
          iVar5 = sqlite3VdbeParameterIndex(local_f0,(char *)puVar9,nName);
        }
        local_124 = iVar5;
        iVar5 = local_124;
        lVar11 = (long)local_124;
        pMVar3 = pVVar4->aVar;
        uVar2 = pMVar3[lVar11 + -1].flags;
        if ((uVar2 & 1) == 0) {
          if ((uVar2 & 4) == 0) {
            if ((uVar2 & 8) == 0) {
              if ((uVar2 & 2) == 0) {
                if ((uVar2 >> 0xe & 1) == 0) {
                  local_f8 = lVar11;
                  if (local_120.nChar + 2 < local_120.nAlloc) {
                    (local_120.zText + local_120.nChar)[0] = 'x';
                    (local_120.zText + local_120.nChar)[1] = '\'';
                    local_120.nChar = local_120.nChar + 2;
                  }
                  else {
                    enlargeAndAppend(&local_120,"x\'",2);
                  }
                  if (0 < (long)pMVar3[lVar11 + -1].n) {
                    lVar10 = 0;
                    local_a0 = (long)pMVar3[lVar11 + -1].n;
                    do {
                      sqlite3XPrintf(&local_120,0,"%02x",(ulong)(byte)pMVar3[lVar11 + -1].z[lVar10])
                      ;
                      lVar10 = lVar10 + 1;
                    } while (local_a0 != lVar10);
                  }
                  if (local_120.nChar + 1 < local_120.nAlloc) {
                    local_120.zText[local_120.nChar] = '\'';
                    local_120.nChar = local_120.nChar + 1;
                  }
                  else {
                    enlargeAndAppend(&local_120,"\'",1);
                  }
                  iVar5 = (int)local_f8;
                }
                else {
                  sqlite3XPrintf(&local_120,0,"zeroblob(%d)",
                                 (ulong)(uint)pMVar3[lVar11 + -1].u.nZero);
                }
              }
              else if (local_a8->enc == '\x01') {
                sqlite3XPrintf(&local_120,0,"\'%.*q\'",(ulong)(uint)pMVar3[lVar11 + -1].n);
              }
              else {
                local_c8 = 0;
                local_d8 = 0;
                uStack_d0 = 0;
                local_e8.r = 0.0;
                uStack_e0 = 0;
                local_b8 = 0;
                psStack_c0 = local_a8;
                sqlite3VdbeMemSetStr
                          ((Mem *)&local_e8,pMVar3[lVar11 + -1].z,pMVar3[lVar11 + -1].n,
                           local_a8->enc,(_func_void_void_ptr *)0x0);
                if (((uStack_e0 & 2) != 0) && (uStack_e0._2_1_ != '\x01')) {
                  sqlite3VdbeMemTranslate((Mem *)&local_e8,'\x01');
                }
                sqlite3XPrintf(&local_120,0,"\'%.*q\'",uStack_e0 >> 0x20);
                if (((uStack_e0 & 0x2460) != 0) || ((int)local_c8 != 0)) {
                  vdbeMemClear((Mem *)&local_e8);
                }
              }
            }
            else {
              sqlite3XPrintf(&local_120,0,"%!.15g",pMVar3[lVar11 + -1].u.nZero);
            }
          }
          else {
            sqlite3XPrintf(&local_120,0,"%lld",pMVar3[lVar11 + -1].u.r);
          }
        }
        else if (local_120.nChar + 4 < local_120.nAlloc) {
          builtin_strncpy(local_120.zText + local_120.nChar,"NULL",4);
          local_120.nChar = local_120.nChar + 4;
        }
        else {
          enlargeAndAppend(&local_120,"NULL",4);
        }
        zRawSql = (char *)(puVar9 + nName);
        iVar5 = iVar5 + 1;
      } while (*zRawSql != '\0');
    }
  }
  else if (*zRawSql != '\0') {
    do {
      lVar11 = 1;
      lVar10 = 0x100000000;
      do {
        lVar8 = lVar10;
        lVar6 = lVar11;
        if (zRawSql[lVar6 + -1] == '\n') break;
        lVar11 = lVar6 + 1;
        lVar10 = lVar8 + 0x100000000;
      } while (zRawSql[lVar6] != '\0');
      if (local_120.nChar + 3 < local_120.nAlloc) {
        local_120.zText[(long)local_120.nChar + 2] = ' ';
        (local_120.zText + local_120.nChar)[0] = '-';
        (local_120.zText + local_120.nChar)[1] = '-';
        local_120.nChar = local_120.nChar + 3;
      }
      else {
        enlargeAndAppend(&local_120,"-- ",3);
      }
      iVar5 = local_120.nChar + (int)lVar6;
      if (iVar5 < local_120.nAlloc) {
        lVar11 = (long)local_120.nChar;
        local_120.nChar = iVar5;
        memcpy(local_120.zText + lVar11,zRawSql,lVar8 >> 0x20);
      }
      else {
        enlargeAndAppend(&local_120,zRawSql,(int)lVar6);
      }
      zRawSql = zRawSql + lVar6;
    } while (*zRawSql != '\0');
  }
  pcVar7 = sqlite3StrAccumFinish(&local_120);
  return pcVar7;
}

Assistant:

SQLITE_PRIVATE char *sqlite3VdbeExpandSql(
  Vdbe *p,                 /* The prepared statement being evaluated */
  const char *zRawSql      /* Raw text of the SQL statement */
){
  sqlite3 *db;             /* The database connection */
  int idx = 0;             /* Index of a host parameter */
  int nextIndex = 1;       /* Index of next ? host parameter */
  int n;                   /* Length of a token prefix */
  int nToken;              /* Length of the parameter token */
  int i;                   /* Loop counter */
  Mem *pVar;               /* Value of a host parameter */
  StrAccum out;            /* Accumulate the output here */
  char zBase[100];         /* Initial working space */

  db = p->db;
  sqlite3StrAccumInit(&out, zBase, sizeof(zBase), 
                      db->aLimit[SQLITE_LIMIT_LENGTH]);
  out.db = db;
  if( db->nVdbeExec>1 ){
    while( *zRawSql ){
      const char *zStart = zRawSql;
      while( *(zRawSql++)!='\n' && *zRawSql );
      sqlite3StrAccumAppend(&out, "-- ", 3);
      assert( (zRawSql - zStart) > 0 );
      sqlite3StrAccumAppend(&out, zStart, (int)(zRawSql-zStart));
    }
  }else{
    while( zRawSql[0] ){
      n = findNextHostParameter(zRawSql, &nToken);
      assert( n>0 );
      sqlite3StrAccumAppend(&out, zRawSql, n);
      zRawSql += n;
      assert( zRawSql[0] || nToken==0 );
      if( nToken==0 ) break;
      if( zRawSql[0]=='?' ){
        if( nToken>1 ){
          assert( sqlite3Isdigit(zRawSql[1]) );
          sqlite3GetInt32(&zRawSql[1], &idx);
        }else{
          idx = nextIndex;
        }
      }else{
        assert( zRawSql[0]==':' || zRawSql[0]=='$' || zRawSql[0]=='@' );
        testcase( zRawSql[0]==':' );
        testcase( zRawSql[0]=='$' );
        testcase( zRawSql[0]=='@' );
        idx = sqlite3VdbeParameterIndex(p, zRawSql, nToken);
        assert( idx>0 );
      }
      zRawSql += nToken;
      nextIndex = idx + 1;
      assert( idx>0 && idx<=p->nVar );
      pVar = &p->aVar[idx-1];
      if( pVar->flags & MEM_Null ){
        sqlite3StrAccumAppend(&out, "NULL", 4);
      }else if( pVar->flags & MEM_Int ){
        sqlite3XPrintf(&out, 0, "%lld", pVar->u.i);
      }else if( pVar->flags & MEM_Real ){
        sqlite3XPrintf(&out, 0, "%!.15g", pVar->u.r);
      }else if( pVar->flags & MEM_Str ){
        int nOut;  /* Number of bytes of the string text to include in output */
#ifndef SQLITE_OMIT_UTF16
        u8 enc = ENC(db);
        Mem utf8;
        if( enc!=SQLITE_UTF8 ){
          memset(&utf8, 0, sizeof(utf8));
          utf8.db = db;
          sqlite3VdbeMemSetStr(&utf8, pVar->z, pVar->n, enc, SQLITE_STATIC);
          sqlite3VdbeChangeEncoding(&utf8, SQLITE_UTF8);
          pVar = &utf8;
        }
#endif
        nOut = pVar->n;
#ifdef SQLITE_TRACE_SIZE_LIMIT
        if( nOut>SQLITE_TRACE_SIZE_LIMIT ){
          nOut = SQLITE_TRACE_SIZE_LIMIT;
          while( nOut<pVar->n && (pVar->z[nOut]&0xc0)==0x80 ){ nOut++; }
        }
#endif    
        sqlite3XPrintf(&out, 0, "'%.*q'", nOut, pVar->z);
#ifdef SQLITE_TRACE_SIZE_LIMIT
        if( nOut<pVar->n ){
          sqlite3XPrintf(&out, 0, "/*+%d bytes*/", pVar->n-nOut);
        }
#endif
#ifndef SQLITE_OMIT_UTF16
        if( enc!=SQLITE_UTF8 ) sqlite3VdbeMemRelease(&utf8);
#endif
      }else if( pVar->flags & MEM_Zero ){
        sqlite3XPrintf(&out, 0, "zeroblob(%d)", pVar->u.nZero);
      }else{
        int nOut;  /* Number of bytes of the blob to include in output */
        assert( pVar->flags & MEM_Blob );
        sqlite3StrAccumAppend(&out, "x'", 2);
        nOut = pVar->n;
#ifdef SQLITE_TRACE_SIZE_LIMIT
        if( nOut>SQLITE_TRACE_SIZE_LIMIT ) nOut = SQLITE_TRACE_SIZE_LIMIT;
#endif
        for(i=0; i<nOut; i++){
          sqlite3XPrintf(&out, 0, "%02x", pVar->z[i]&0xff);
        }
        sqlite3StrAccumAppend(&out, "'", 1);
#ifdef SQLITE_TRACE_SIZE_LIMIT
        if( nOut<pVar->n ){
          sqlite3XPrintf(&out, 0, "/*+%d bytes*/", pVar->n-nOut);
        }
#endif
      }
    }
  }
  return sqlite3StrAccumFinish(&out);
}